

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AZHighLevelEncoder.cpp
# Opt level: O3

EncodingState *
ZXing::Aztec::AddBinaryShiftChar
          (EncodingState *__return_storage_ptr__,EncodingState *state,int index)

{
  int iVar1;
  pointer pTVar2;
  pointer pTVar3;
  EncodingState *extraout_RAX;
  EncodingState *pEVar4;
  EncodingState *extraout_RAX_00;
  uint uVar5;
  uint uVar6;
  int iVar7;
  vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> tokens;
  undefined1 local_78 [32];
  int local_58;
  vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> local_48;
  
  std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::vector
            (&local_48,&state->tokens);
  uVar5 = state->mode;
  iVar7 = state->bitCount;
  if (((ulong)uVar5 == 4) || (uVar5 == 2)) {
    uVar5 = *(uint *)(LATCH_TABLE + (ulong)uVar5 * 0x14);
    local_78._0_4_ = (uVar5 & 0xffff) - (uVar5 & 0xffff0000);
    std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::
    emplace_back<ZXing::Aztec::Token>(&local_48,(Token *)local_78);
    iVar7 = iVar7 + ((int)uVar5 >> 0x10);
    uVar5 = 0;
  }
  iVar1 = state->binaryShiftByteCount;
  uVar6 = 0x12;
  if ((iVar1 != 0) && (iVar1 != 0x1f)) {
    uVar6 = iVar1 == 0x3e | 8;
  }
  std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::vector
            (&__return_storage_ptr__->tokens,&local_48);
  __return_storage_ptr__->mode = uVar5;
  uVar5 = state->binaryShiftByteCount + 1;
  __return_storage_ptr__->binaryShiftByteCount = uVar5;
  __return_storage_ptr__->bitCount = uVar6 + iVar7;
  pEVar4 = (EncodingState *)(ulong)uVar5;
  if (uVar5 == 0x81e) {
    EndBinaryShift((EncodingState *)local_78,__return_storage_ptr__,index + 1);
    pTVar2 = (__return_storage_ptr__->tokens).
             super__Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    pTVar3 = (__return_storage_ptr__->tokens).
             super__Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->tokens).
    super__Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_78._0_8_;
    (__return_storage_ptr__->tokens).
    super__Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_78._8_8_;
    (__return_storage_ptr__->tokens).
    super__Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_78._16_8_;
    local_78._0_8_ = (pointer)0x0;
    local_78._8_8_ = (pointer)0x0;
    local_78._16_8_ = (pointer)0x0;
    if (pTVar2 == (pointer)0x0) {
      __return_storage_ptr__->bitCount = local_58;
      __return_storage_ptr__->mode = local_78._24_4_;
      __return_storage_ptr__->binaryShiftByteCount = local_78._28_4_;
      pEVar4 = (EncodingState *)local_78._24_8_;
    }
    else {
      operator_delete(pTVar2,(long)pTVar3 - (long)pTVar2);
      __return_storage_ptr__->bitCount = local_58;
      __return_storage_ptr__->mode = local_78._24_4_;
      __return_storage_ptr__->binaryShiftByteCount = local_78._28_4_;
      pEVar4 = (EncodingState *)local_78._24_8_;
      if ((pointer)local_78._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_78._0_8_,local_78._16_8_ - local_78._0_8_);
        pEVar4 = extraout_RAX;
      }
    }
  }
  if (local_48.super__Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    pEVar4 = extraout_RAX_00;
  }
  return pEVar4;
}

Assistant:

static EncodingState AddBinaryShiftChar(const EncodingState& state, int index)
{
	auto tokens = state.tokens;
	int mode = state.mode;
	int bitCount = state.bitCount;
	if (state.mode == MODE_PUNCT || state.mode == MODE_DIGIT) {
		//assert binaryShiftByteCount == 0;
		int latch = LATCH_TABLE[mode][MODE_UPPER];
		tokens.push_back(Token::CreateSimple(latch & 0xFFFF, latch >> 16));
		bitCount += latch >> 16;
		mode = MODE_UPPER;
	}
	int deltaBitCount = (state.binaryShiftByteCount == 0 || state.binaryShiftByteCount == 31) ? 18 : (state.binaryShiftByteCount == 62) ? 9 : 8;
	EncodingState result{ tokens, mode, state.binaryShiftByteCount + 1, bitCount + deltaBitCount };
	if (result.binaryShiftByteCount == 2047 + 31) {
		// The string is as long as it's allowed to be.  We should end it.
		result = EndBinaryShift(result, index + 1);
	}
	return result;
}